

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDA.cpp
# Opt level: O0

CFG * __thiscall PDA::toCFG(PDA *this)

{
  CFG *this_00;
  allocator<char> local_a9;
  string local_a8;
  CFG *local_88;
  CFG *cfg;
  undefined1 local_68 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  strVec;
  undefined1 local_40 [8];
  vector<Production_*,_std::allocator<Production_*>_> r;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  v;
  PDA *this_local;
  
  getCFGVariables_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&r.super__Vector_base<Production_*,_std::allocator<Production_*>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage,this);
  getCFGProductions((vector<Production_*,_std::allocator<Production_*>_> *)local_40,this);
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)&cfg,&this->inputAlphabetS);
  toVecStr_abi_cxx11_((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_68,this,(vector<char,_std::allocator<char>_> *)&cfg);
  std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)&cfg);
  this_00 = (CFG *)operator_new(0x68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a8,"S",&local_a9);
  CFG::CFG(this_00,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&r.super__Vector_base<Production_*,_std::allocator<Production_*>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_68,(vector<Production_*,_std::allocator<Production_*>_> *)local_40,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator(&local_a9);
  local_88 = this_00;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_68);
  std::vector<Production_*,_std::allocator<Production_*>_>::~vector
            ((vector<Production_*,_std::allocator<Production_*>_> *)local_40);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&r.super__Vector_base<Production_*,_std::allocator<Production_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  return this_00;
}

Assistant:

CFG *PDA::toCFG() {
    std::vector<std::string> v = getCFGVariables(); // set of variables
    std::vector<Production*> r = getCFGProductions();

    std::vector<std::string> strVec = toVecStr(inputAlphabetS);
    CFG* cfg = new CFG(v, strVec, r, "S");
    return cfg;
}